

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall TorController::disconnected_cb(TorController *this,TorControlConnection *_conn)

{
  CService *addr;
  long lVar1;
  bool bVar2;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  timeval time;
  size_type local_30;
  Network local_28;
  uint32_t uStack_24;
  uint16_t local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  addr = &this->service;
  bVar2 = CNetAddr::IsValid(&addr->super_CNetAddr);
  if (bVar2) {
    RemoveLocal(addr);
  }
  CService::CService((CService *)&time);
  if (0x10 < (this->service).super_CNetAddr.m_addr._size) {
    free((addr->super_CNetAddr).m_addr._union.indirect_contents.indirect);
  }
  *(undefined4 *)&(addr->super_CNetAddr).m_addr._union = (undefined4)time.tv_sec;
  *(undefined4 *)((long)&(this->service).super_CNetAddr.m_addr._union + 4) = time.tv_sec._4_4_;
  (this->service).super_CNetAddr.m_addr._union.indirect_contents.capacity = (size_type)time.tv_usec;
  *(undefined4 *)((long)&(this->service).super_CNetAddr.m_addr._union + 0xc) = time.tv_usec._4_4_;
  (this->service).super_CNetAddr.m_addr._size = local_30;
  (this->service).super_CNetAddr.m_net = local_28;
  (this->service).super_CNetAddr.m_scope_id = uStack_24;
  (this->service).port = local_20;
  if (this->reconnect == true) {
    this_00 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,TOR,Debug);
    if (bVar2) {
      logging_function._M_str = "disconnected_cb";
      logging_function._M_len = 0xf;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x27a,TOR,Debug,
                 "Not connected to Tor control port %s, trying to reconnect\n",
                 &this->m_tor_control_center);
    }
    time = MillisToTimeval((long)(this->reconnect_timeout * 1000.0));
    if (this->reconnect_ev != (event *)0x0) {
      event_add(this->reconnect_ev,&time);
    }
    this->reconnect_timeout = this->reconnect_timeout * 1.5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::disconnected_cb(TorControlConnection& _conn)
{
    // Stop advertising service when disconnected
    if (service.IsValid())
        RemoveLocal(service);
    service = CService();
    if (!reconnect)
        return;

    LogDebug(BCLog::TOR, "Not connected to Tor control port %s, trying to reconnect\n", m_tor_control_center);

    // Single-shot timer for reconnect. Use exponential backoff.
    struct timeval time = MillisToTimeval(int64_t(reconnect_timeout * 1000.0));
    if (reconnect_ev)
        event_add(reconnect_ev, &time);
    reconnect_timeout *= RECONNECT_TIMEOUT_EXP;
}